

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int unqlite_kv_store_fmt(unqlite *pDb,void *pKey,int nKeyLen,char *zFormat,...)

{
  char in_AL;
  unqlite_kv_engine *puVar1;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_128 [32];
  undefined8 local_108;
  undefined8 local_100;
  undefined8 local_f8;
  undefined8 local_e8;
  undefined8 local_d8;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined1 local_78 [8];
  va_list ap;
  SyBlob sWorker;
  int rc;
  unqlite_kv_engine *pEngine;
  char *zFormat_local;
  int nKeyLen_local;
  void *pKey_local;
  unqlite *pDb_local;
  
  if (in_AL != '\0') {
    local_f8 = in_XMM0_Qa;
    local_e8 = in_XMM1_Qa;
    local_d8 = in_XMM2_Qa;
    local_c8 = in_XMM3_Qa;
    local_b8 = in_XMM4_Qa;
    local_a8 = in_XMM5_Qa;
    local_98 = in_XMM6_Qa;
    local_88 = in_XMM7_Qa;
  }
  if ((pDb == (unqlite *)0x0) || (pDb->nMagic != 0xdb7c2712)) {
    pDb_local._4_4_ = -0x18;
  }
  else {
    local_108 = in_R8;
    local_100 = in_R9;
    puVar1 = unqlitePagerGetKvEngine(pDb);
    if (puVar1->pIo->pMethods->xReplace ==
        (_func_int_unqlite_kv_engine_ptr_void_ptr_int_void_ptr_unqlite_int64 *)0x0) {
      unqliteGenError(pDb,"xReplace() method not implemented in the underlying storage engine");
      sWorker._28_4_ = 0xffffffef;
    }
    else {
      zFormat_local._4_4_ = nKeyLen;
      if (nKeyLen < 0) {
        zFormat_local._4_4_ = SyStrlen((char *)pKey);
      }
      if (zFormat_local._4_4_ == 0) {
        unqliteGenError(pDb,"Empty key");
        sWorker._28_4_ = 0xfffffffd;
      }
      else {
        SyBlobInit((SyBlob *)&ap[0].reg_save_area,&pDb->sMem);
        ap[0].overflow_arg_area = local_128;
        ap[0]._0_8_ = &stack0x00000008;
        local_78._4_4_ = 0x30;
        local_78._0_4_ = 0x20;
        SyBlobFormatAp((SyBlob *)&ap[0].reg_save_area,zFormat,(__va_list_tag *)local_78);
        sWorker._28_4_ =
             (*puVar1->pIo->pMethods->xReplace)
                       (puVar1,pKey,zFormat_local._4_4_,sWorker.pAllocator,
                        (unqlite_int64)sWorker.pBlob);
        SyBlobRelease((SyBlob *)&ap[0].reg_save_area);
      }
    }
    pDb_local._4_4_ = sWorker._28_4_;
  }
  return pDb_local._4_4_;
}

Assistant:

int unqlite_kv_store_fmt(unqlite *pDb,const void *pKey,int nKeyLen,const char *zFormat,...)
{
	unqlite_kv_engine *pEngine;
	int rc;
	if( UNQLITE_DB_MISUSE(pDb) ){
		return UNQLITE_CORRUPT;
	}
#if defined(UNQLITE_ENABLE_THREADS)
	 /* Acquire DB mutex */
	 SyMutexEnter(sUnqlMPGlobal.pMutexMethods, pDb->pMutex); /* NO-OP if sUnqlMPGlobal.nThreadingLevel != UNQLITE_THREAD_LEVEL_MULTI */
	 if( sUnqlMPGlobal.nThreadingLevel > UNQLITE_THREAD_LEVEL_SINGLE && 
		 UNQLITE_THRD_DB_RELEASE(pDb) ){
			 return UNQLITE_ABORT; /* Another thread have released this instance */
	 }
#endif
	 /* Point to the underlying storage engine */
	 pEngine = unqlitePagerGetKvEngine(pDb);
	 if( pEngine->pIo->pMethods->xReplace == 0 ){
		 /* Storage engine does not implement such method */
		 unqliteGenError(pDb,"xReplace() method not implemented in the underlying storage engine");
		 rc = UNQLITE_NOTIMPLEMENTED;
	 }else{
		 if( nKeyLen < 0 ){
			 /* Assume a null terminated string and compute it's length */
			 nKeyLen = SyStrlen((const char *)pKey);
		 }
		 if( !nKeyLen ){
			 unqliteGenError(pDb,"Empty key");
			 rc = UNQLITE_EMPTY;
		 }else{
			 SyBlob sWorker; /* Working buffer */
			 va_list ap;
			 SyBlobInit(&sWorker,&pDb->sMem);
			 /* Format the data */
			 va_start(ap,zFormat);
			 SyBlobFormatAp(&sWorker,zFormat,ap);
			 va_end(ap);
			 /* Perform the requested operation */
			 rc = pEngine->pIo->pMethods->xReplace(pEngine,pKey,nKeyLen,SyBlobData(&sWorker),SyBlobLength(&sWorker));
			 /* Clean up */
			 SyBlobRelease(&sWorker);
		 }
	 }
#if defined(UNQLITE_ENABLE_THREADS)
	 /* Leave DB mutex */
	 SyMutexLeave(sUnqlMPGlobal.pMutexMethods,pDb->pMutex); /* NO-OP if sUnqlMPGlobal.nThreadingLevel != UNQLITE_THREAD_LEVEL_MULTI */
#endif
	return rc;
}